

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

ssize_t __thiscall gguf_writer::write(gguf_writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,(char *)CONCAT44(in_register_00000034,__fd),&local_31);
  write(this,(int)local_30,__buf_00,__n);
  sVar1 = std::__cxx11::string::~string(local_30);
  return sVar1;
}

Assistant:

void write(const char * val) const {
        write(std::string(val));
    }